

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

t_int * scalarover_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  long lVar3;
  t_int tVar4;
  long lVar5;
  
  lVar2 = w[1];
  fVar1 = *(float *)w[2];
  lVar3 = w[3];
  tVar4 = w[4];
  for (lVar5 = 0; (int)tVar4 != (int)lVar5; lVar5 = lVar5 + 1) {
    *(float *)(lVar3 + lVar5 * 4) =
         *(float *)(lVar2 + lVar5 * 4) *
         (float)(~-(uint)(fVar1 != 0.0) & (uint)fVar1 | (uint)(1.0 / fVar1) & -(uint)(fVar1 != 0.0))
    ;
  }
  return w + 5;
}

Assistant:

t_int *scalarover_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float f = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    if(f) f = 1./f;
    while (n--) *out++ = *in++ * f;
    return (w+5);
}